

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall Console::Prompt::Private::promptRemoveNext(Private *this)

{
  ulong size;
  uint *puVar1;
  usize uVar2;
  Data *pDVar3;
  ulong uVar4;
  String local_38;
  
  size = this->caretPos;
  puVar1 = (this->input)._begin.item;
  uVar4 = (long)(this->input)._end.item - (long)puVar1 >> 2;
  if (size < uVar4) {
    local_38._data.len = uVar4 - 1;
    if (size == local_38._data.len) {
      local_38.data = (Data *)((ulong)local_38.data & 0xffffffff00000000);
      Array<unsigned_int>::resize(&this->input,size,(uint *)&local_38);
    }
    else {
      local_38.data = (Data *)0x0;
      local_38._data.str = (char *)0x0;
      Array<unsigned_int>::append((Array<unsigned_int> *)&local_38,puVar1,size);
      puVar1 = (this->input)._begin.item;
      Array<unsigned_int>::append
                ((Array<unsigned_int> *)&local_38,puVar1 + this->caretPos + 1,
                 ~this->caretPos + ((long)(this->input)._end.item - (long)puVar1 >> 2));
      uVar2 = (this->input)._capacity;
      (this->input)._capacity = local_38._data.len;
      pDVar3 = (Data *)(this->input)._begin.item;
      puVar1 = (this->input)._end.item;
      (this->input)._begin.item = (uint *)local_38.data;
      (this->input)._end.item = (uint *)local_38._data.str;
      local_38.data = pDVar3;
      local_38._data.str = (char *)puVar1;
      local_38._data.len = uVar2;
      Array<unsigned_int>::~Array((Array<unsigned_int> *)&local_38);
    }
    local_38.data = &local_38._data;
    local_38._data.ref = 0;
    local_38._data.str = " ";
    local_38._data.len = 1;
    promptWrite(this,((long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2) +
                     this->caretPos,&local_38);
    String::~String(&local_38);
  }
  return;
}

Assistant:

void promptRemoveNext()
  {
    if(caretPos < input.size())
    {
      if(caretPos != input.size() - 1)
      {
        Array<conchar> newInput(input.size() - 1);
        newInput.append(input,  caretPos);
        newInput.append((conchar*)input + caretPos + 1, input.size() - (caretPos + 1));
        input.swap(newInput);
      }
      else
        input.resize(caretPos);
      promptWrite(prompt.size() + caretPos, " ");
    }
  }